

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O1

void __thiscall
capnp::compiler::CompilerMain::setRootType(kj::StringPtr)::CliArgumentErrorReporter::
addError(unsigned_int,unsigned_int,kj::StringPtr_
          (void *this,uint32_t startByte,uint32_t endByte,StringPtr message)

{
  long lVar1;
  undefined8 uVar2;
  char *__src;
  StringPtr *pSVar3;
  undefined1 *__n;
  String result;
  StringPtr *in_stack_ffffffffffffffb8;
  StringPtr *pSStack_40;
  ArrayDisposer *local_38;
  int local_30;
  uint32_t local_2c;
  char *local_28;
  StringPtr *local_20;
  
  pSVar3 = (StringPtr *)message.content.size_;
  __src = message.content.ptr;
  local_2c = endByte;
  local_28 = __src;
  local_20 = pSVar3;
  if (startByte < endByte) {
    local_30 = startByte + 1;
    kj::str<unsigned_int,char_const(&)[2],unsigned_int&,char_const(&)[3],kj::StringPtr&>
              ((String *)&stack0xffffffffffffffb8,(kj *)&local_30,(uint *)0x237d2c,
               (char (*) [2])&local_2c,(uint *)0x2106dc,(char (*) [3])&local_28,
               in_stack_ffffffffffffffb8);
    if (*(char *)((long)this + 8) == '\x01') {
      *(undefined1 *)((long)this + 8) = 0;
      lVar1 = *(long *)((long)this + 0x10);
      if (lVar1 != 0) {
        uVar2 = *(undefined8 *)((long)this + 0x18);
        *(undefined8 *)((long)this + 0x10) = 0;
        *(undefined8 *)((long)this + 0x18) = 0;
        (**(code **)**(undefined8 **)((long)this + 0x20))
                  (*(undefined8 **)((long)this + 0x20),lVar1,1,uVar2,uVar2,0);
      }
    }
  }
  else if (startByte == 0) {
    kj::heapString((String *)&stack0xffffffffffffffb8,(size_t)((long)&pSVar3[-1].content.size_ + 7))
    ;
    __n = (undefined1 *)((long)&pSVar3[-1].content.size_ + 7);
    if (__n != (undefined1 *)0x0) {
      pSVar3 = pSStack_40;
      if (pSStack_40 != (StringPtr *)0x0) {
        pSVar3 = in_stack_ffffffffffffffb8;
      }
      memcpy(pSVar3,__src,(size_t)__n);
    }
    if (*(char *)((long)this + 8) == '\x01') {
      *(undefined1 *)((long)this + 8) = 0;
      lVar1 = *(long *)((long)this + 0x10);
      if (lVar1 != 0) {
        uVar2 = *(undefined8 *)((long)this + 0x18);
        *(undefined8 *)((long)this + 0x10) = 0;
        *(undefined8 *)((long)this + 0x18) = 0;
        (**(code **)**(undefined8 **)((long)this + 0x20))
                  (*(undefined8 **)((long)this + 0x20),lVar1,1,uVar2,uVar2,0);
      }
    }
  }
  else {
    local_30 = startByte + 1;
    kj::str<unsigned_int,char_const(&)[3],kj::StringPtr&>
              ((String *)&stack0xffffffffffffffb8,(kj *)&local_30,(uint *)0x2106dc,
               (char (*) [3])&local_28,pSVar3);
    if (*(char *)((long)this + 8) == '\x01') {
      *(undefined1 *)((long)this + 8) = 0;
      lVar1 = *(long *)((long)this + 0x10);
      if (lVar1 != 0) {
        uVar2 = *(undefined8 *)((long)this + 0x18);
        *(undefined8 *)((long)this + 0x10) = 0;
        *(undefined8 *)((long)this + 0x18) = 0;
        (**(code **)**(undefined8 **)((long)this + 0x20))
                  (*(undefined8 **)((long)this + 0x20),lVar1,1,uVar2,uVar2,0);
      }
    }
  }
  *(StringPtr **)((long)this + 0x10) = in_stack_ffffffffffffffb8;
  *(StringPtr **)((long)this + 0x18) = pSStack_40;
  *(ArrayDisposer **)((long)this + 0x20) = local_38;
  *(undefined1 *)((long)this + 8) = 1;
  return;
}

Assistant:

void addError(uint32_t startByte, uint32_t endByte, kj::StringPtr message) override {
        if (startByte < endByte) {
          error = kj::str(startByte + 1, "-", endByte, ": ", message);
        } else if (startByte > 0) {
          error = kj::str(startByte + 1, ": ", message);
        } else {
          error = kj::str(message);
        }
      }